

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy_generic.cpp
# Opt level: O1

QList<QNetworkProxy> *
QNetworkProxyFactory::systemProxyForQuery
          (QList<QNetworkProxy> *__return_storage_ptr__,QNetworkProxyQuery *query)

{
  long lVar1;
  Data *pDVar2;
  QNetworkProxy *pQVar3;
  qsizetype qVar4;
  QByteArray *pQVar5;
  Data *pDVar6;
  byte bVar7;
  char cVar8;
  quint16 qVar9;
  CutResult CVar10;
  int iVar11;
  QueryType QVar12;
  QArrayData *pQVar13;
  char *pcVar14;
  longlong lVar15;
  QArrayData *pQVar16;
  long lVar17;
  longlong __tmp;
  long in_FS_OFFSET;
  bool bVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QByteArrayView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  undefined1 auVar34 [16];
  QNetworkProxy proxy;
  QUrl url;
  QString local_100;
  QString local_e8;
  QNetworkProxy local_c8;
  QUrl local_c0;
  QArrayDataPointer<QNetworkProxy> local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QNetworkProxy *)0x0;
  local_b8.size = 0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_78);
  QByteArray::trimmed_helper((QByteArray *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    bVar18 = false;
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxyQuery::peerHostName(&local_78,query);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_98);
    bVar18 = (undefined1 *)local_98.size != (undefined1 *)0x0;
    if (bVar18) {
      pQVar5 = local_98.ptr;
      lVar1 = local_98.size * 0x18;
      lVar17 = 0;
      do {
        QVar19.m_data = *(char **)((long)&(pQVar5->d).ptr + lVar17);
        QVar19.m_size = *(qsizetype *)((long)&(pQVar5->d).size + lVar17);
        auVar34 = QtPrivate::trimmed(QVar19);
        if ((auVar34._0_8_ != 0) && (*auVar34._8_8_ == '*')) {
          local_e8.d.d = (Data *)0x1;
          local_100.d.d = (Data *)0xffffffffffffffff;
          CVar10 = QtPrivate::QContainerImplHelper::mid
                             (auVar34._0_8_,(qsizetype *)&local_e8,(qsizetype *)&local_100);
          if (CVar10 == Null) {
            auVar34 = ZEXT816(0);
          }
          else {
            auVar34._8_8_ = auVar34._8_8_ + (long)local_e8.d.d;
            auVar34._0_8_ = local_100.d.d;
          }
        }
        pcVar14 = auVar34._8_8_;
        pQVar13 = auVar34._0_8_;
        if ((pQVar13 != (QArrayData *)0x0) && (pcVar14[(long)((long)&pQVar13[-1].alloc + 7)] == '.')
           ) {
          bVar7 = QString::endsWith((QChar)(char16_t)&local_78,0x2e);
          pQVar13 = (QArrayData *)((long)pQVar13 - (ulong)(bVar7 ^ 1));
        }
        if ((pQVar13 != (QArrayData *)0x0) && (*pcVar14 == '.')) {
          local_e8.d.d = (Data *)0x1;
          local_100.d.d = (Data *)0xffffffffffffffff;
          CVar10 = QtPrivate::QContainerImplHelper::mid
                             ((qsizetype)pQVar13,(qsizetype *)&local_e8,(qsizetype *)&local_100);
          if (CVar10 == Null) {
            pQVar13 = (QArrayData *)0x0;
            pcVar14 = (char *)0x0;
          }
          else {
            pcVar14 = pcVar14 + (long)local_e8.d.d;
            pQVar13 = &(local_100.d.d)->super_QArrayData;
          }
        }
        QVar20.m_data = (char *)pQVar13;
        QVar20.m_size = (qsizetype)&local_78;
        cVar8 = QString::endsWith(QVar20,(CaseSensitivity)pcVar14);
        if ((cVar8 != '\0') &&
           (((QArrayData *)local_78.d.size == pQVar13 ||
            (local_78.d.ptr
             [(long)((long)&(((QBasicAtomicInt *)local_78.d.size)->_q_value).
                            super___atomic_base<int>._M_i + ~(ulong)pQVar13)] == L'.')))) break;
        lVar17 = lVar17 + 0x18;
        bVar18 = lVar1 != lVar17;
      } while (bVar18);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar18) {
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_78.d.size = 0;
    local_78.d._0_16_ = ZEXT816(0);
    local_98.size = 0;
    local_98._0_16_ = ZEXT816(0);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)&local_e8,NoProxy,&local_58,0,&local_78,(QString *)&local_98);
    QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy>
              ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,(QNetworkProxy *)&local_e8
              );
    QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
    (__return_storage_ptr__->d).d = local_b8.d;
    (__return_storage_ptr__->d).ptr = local_b8.ptr;
    (__return_storage_ptr__->d).size = local_b8.size;
    if (local_b8.d != (Data *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_e8);
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0023b13d;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0023b13d;
    lVar15 = 2;
    pQVar13 = &(local_78.d.d)->super_QArrayData;
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxyQuery::protocolTag(&local_58,query);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x3) {
      QVar23.m_data = local_58.d.ptr;
      QVar23.m_size = 3;
      QVar30.m_data = "ftp";
      QVar30.m_size = 3;
      QtPrivate::equalStrings(QVar23,QVar30);
    }
    else if ((undefined1 *)local_58.d.size == (undefined1 *)0x5) {
      QVar22.m_data = local_58.d.ptr;
      QVar22.m_size = 5;
      QVar29.m_data = "https";
      QVar29.m_size = 5;
      QtPrivate::equalStrings(QVar22,QVar29);
    }
    else if ((undefined1 *)local_58.d.size == (undefined1 *)0x4) {
      QVar21.m_data = local_58.d.ptr;
      QVar21.m_size = 4;
      QVar28.m_data = "http";
      QVar28.m_size = 4;
      QtPrivate::equalStrings(QVar21,QVar28);
    }
    qgetenv((char *)&local_78);
    qVar4 = local_78.d.size;
    auVar34 = (undefined1  [16])local_78.d._0_16_;
    pDVar6 = local_78.d.d;
    pQVar13 = &(local_78.d.d)->super_QArrayData;
    pQVar16 = (QArrayData *)local_78.d.size;
    local_78.d._0_16_ = auVar34;
    local_78.d.size = qVar4;
    if ((QArrayData *)local_78.d.size == (QArrayData *)0x0) {
      qgetenv((char *)&local_78);
      pQVar16 = (QArrayData *)local_78.d.size;
      pQVar13 = &(local_78.d.d)->super_QArrayData;
      local_78.d._0_16_ = auVar34;
      local_78.d.size = qVar4;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,1,0x10);
        }
      }
    }
    if (pQVar16 != (QArrayData *)0x0) {
      local_c0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QVar24.m_data = (storage_type *)pQVar16;
      QVar24.m_size = (qsizetype)&local_78;
      QString::fromLocal8Bit(QVar24);
      QUrl::QUrl(&local_c0,(QString *)&local_78,TolerantMode);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::scheme();
      qVar4 = local_78.d.size;
      switch(local_78.d.size) {
      case 0:
switchD_0023ac48_caseD_0:
        QVar12 = QNetworkProxyQuery::queryType(query);
        if ((QVar12 != UdpSocket) &&
           (QVar12 = QNetworkProxyQuery::queryType(query), QVar12 != TcpServer)) {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar9 = 0x1f90;
          }
          else {
            qVar9 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,HttpProxy,(QString *)&local_98,qVar9,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QList<QNetworkProxy>::operator<<((QList<QNetworkProxy> *)&local_b8,&local_c8);
LAB_0023b0a6:
          QNetworkProxy::~QNetworkProxy(&local_c8);
        }
        break;
      case 4:
switchD_0023ac48_caseD_4:
        QVar25.m_data = local_78.d.ptr;
        QVar25.m_size = qVar4;
        QVar31.m_data = "http";
        QVar31.m_size = 4;
        cVar8 = QtPrivate::equalStrings(QVar25,QVar31);
        if (cVar8 != '\0') goto switchD_0023ac48_caseD_0;
        break;
      case 6:
        QVar26.m_data = local_78.d.ptr;
        QVar26.m_size = local_78.d.size;
        QVar32.m_data = "socks5";
        QVar32.m_size = 6;
        cVar8 = QtPrivate::equalStrings(QVar26,QVar32);
        if (cVar8 != '\0') {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar9 = 0x438;
          }
          else {
            qVar9 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,Socks5Proxy,(QString *)&local_98,qVar9,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                    ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,&local_c8);
          QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
          goto LAB_0023b0a6;
        }
        if ((QArrayData *)qVar4 == (QArrayData *)0x0) goto switchD_0023ac48_caseD_0;
        if ((QArrayData *)qVar4 == (QArrayData *)&DAT_00000004) goto switchD_0023ac48_caseD_4;
        if ((QArrayData *)qVar4 == (QArrayData *)0x7) goto switchD_0023ac48_caseD_7;
        break;
      case 7:
switchD_0023ac48_caseD_7:
        QVar27.m_data = local_78.d.ptr;
        QVar27.m_size = qVar4;
        QVar33.m_data = "socks5h";
        QVar33.m_size = 7;
        cVar8 = QtPrivate::equalStrings(QVar27,QVar33);
        if (cVar8 != '\0') {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar9 = 0x438;
          }
          else {
            qVar9 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,Socks5Proxy,(QString *)&local_98,qVar9,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QNetworkProxy::setCapabilities(&local_c8,(Capabilities)0x10);
          QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                    ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,&local_c8);
          QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
          goto LAB_0023b0a6;
        }
        if ((QArrayData *)qVar4 == (QArrayData *)0x0) goto switchD_0023ac48_caseD_0;
        if ((QArrayData *)qVar4 == (QArrayData *)&DAT_00000004) goto switchD_0023ac48_caseD_4;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      QUrl::~QUrl(&local_c0);
    }
    if (local_b8.size == 0) {
      local_78.d.size = 0;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QByteArray *)0x0;
      local_e8.d.size = 0;
      local_e8.d.d = (Data *)0x0;
      local_e8.d.ptr = (char16_t *)0x0;
      QNetworkProxy::QNetworkProxy
                ((QNetworkProxy *)&local_100,NoProxy,&local_78,0,(QString *)&local_98,&local_e8);
      QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy>
                ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,
                 (QNetworkProxy *)&local_100);
      QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_100);
      if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
          (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
        LOCK();
        *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
        UNLOCK();
        if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    qVar4 = local_b8.size;
    pQVar3 = local_b8.ptr;
    pDVar2 = local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QNetworkProxy *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pQVar3;
    local_b8.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
    if (pQVar13 == (QArrayData *)0x0) goto LAB_0023b13d;
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_0023b13d;
    lVar15 = 1;
  }
  QArrayData::deallocate(pQVar13,lVar15,0x10);
LAB_0023b13d:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkProxy> QNetworkProxyFactory::systemProxyForQuery(const QNetworkProxyQuery &query)
{
    QList<QNetworkProxy> proxyList;

    if (ignoreProxyFor(query))
        return proxyList << QNetworkProxy::NoProxy;

    // No need to care about casing here, QUrl lowercases values already
    const QString queryProtocol = query.protocolTag();
    QByteArray proxy_env;

    if (queryProtocol == "http"_L1)
        proxy_env = qgetenv("http_proxy");
    else if (queryProtocol == "https"_L1)
        proxy_env = qgetenv("https_proxy");
    else if (queryProtocol == "ftp"_L1)
        proxy_env = qgetenv("ftp_proxy");
    else
        proxy_env = qgetenv("all_proxy");

    // Fallback to http_proxy is no protocol specific proxy was found
    if (proxy_env.isEmpty())
        proxy_env = qgetenv("http_proxy");

    if (!proxy_env.isEmpty()) {
        QUrl url = QUrl(QString::fromLocal8Bit(proxy_env));
        const QString scheme = url.scheme();
        if (scheme == "socks5"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxyList << proxy;
        } else if (scheme == "socks5h"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxy.setCapabilities(QNetworkProxy::HostNameLookupCapability);
            proxyList << proxy;
        } else if ((scheme.isEmpty() || scheme == "http"_L1)
                  && query.queryType() != QNetworkProxyQuery::UdpSocket
                  && query.queryType() != QNetworkProxyQuery::TcpServer) {
            QNetworkProxy proxy(QNetworkProxy::HttpProxy, url.host(),
                    url.port() ? url.port() : 8080, url.userName(), url.password());
            proxyList << proxy;
        }
    }
    if (proxyList.isEmpty())
        proxyList << QNetworkProxy::NoProxy;

    return proxyList;
}